

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O3

cl_context
clCreateContext(cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
               _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
               cl_int *errcode_ret)

{
  ObjectMagic *pOVar1;
  int iVar2;
  Device *device;
  Context *this;
  Platform *obj;
  cl_int cVar3;
  ulong uVar4;
  Device *obj_1;
  
  if ((properties != (cl_context_properties *)0x0) && (*properties != 0)) {
    if (*properties != 0x1084) {
LAB_001027d4:
      *errcode_ret = -0x40;
      return (cl_context)0x0;
    }
    if (*(char *)(properties[1] + 8) != '\x01') {
      *errcode_ret = -0x20;
      return (cl_context)0x0;
    }
    if (properties[2] != 0) goto LAB_001027d4;
  }
  if ((num_devices == 0 || devices == (cl_device_id *)0x0) ||
     (pfn_notify == (_func_void_char_ptr_void_ptr_size_t_void_ptr *)0x0 && user_data != (void *)0x0)
     ) {
    *errcode_ret = -0x1e;
    return (cl_context)0x0;
  }
  uVar4 = 0;
  do {
    if (devices[uVar4][8] != (_cl_device_id)0x2) {
      *errcode_ret = -0x21;
      return (cl_context)0x0;
    }
    uVar4 = uVar4 + 1;
  } while (num_devices != uVar4);
  if (num_devices == 1) {
    device = (Device *)*devices;
    this = (Context *)operator_new(0x40,(nothrow_t *)&std::nothrow);
    if (this == (Context *)0x0) {
      cVar3 = -6;
    }
    else {
      cov::Context::Context(this,device,pfn_notify,user_data);
      *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>.m_icdTable = 1;
      cVar3 = 0;
      if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess != false)
      goto LAB_00102632;
      LOCK();
      pOVar1 = &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
      *(int *)pOVar1 = *(int *)pOVar1 + -1;
      UNLOCK();
      iVar2._0_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
      iVar2._1_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess;
      iVar2._2_2_ = *(undefined2 *)
                     &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).field_0xa;
      cVar3 = -5;
      if (iVar2 == 0) {
        operator_delete(this,0x10);
      }
    }
  }
  else {
    cVar3 = -2;
  }
  this = (Context *)0x0;
LAB_00102632:
  *errcode_ret = cVar3;
  return (cl_context)this;
}

Assistant:

CL_API_ENTRY cl_context CL_API_CALL
clCreateContext(const cl_context_properties* properties,
                cl_uint num_devices,
                const cl_device_id* devices,
                void (CL_CALLBACK* pfn_notify)(const char* errinfo,
                                               const void* private_info,
                                               size_t cb,
                                               void* user_data),
                void* user_data,
                cl_int* errcode_ret) CL_API_SUFFIX__VERSION_1_0
{
    if (properties) {
        uint32_t i = 0;
        bool hasPlatformProperties = false;
        while (properties[i] != 0) {
            if (properties[i] == CL_CONTEXT_PLATFORM) {
                if (hasPlatformProperties) {
                    *errcode_ret = CL_INVALID_PROPERTY;
                    return nullptr;
                }
                if (!cov::isValidObject<cov::Platform>(reinterpret_cast<void*>(properties[i + 1]))) {
                    *errcode_ret = CL_INVALID_PLATFORM;
                    return nullptr;
                }
                hasPlatformProperties = true; // platform here not actually used
            } else {
                *errcode_ret = CL_INVALID_PROPERTY;
                return nullptr;
            }
            i += 2;
        }
    }
    if (!devices || num_devices == 0) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    if (!pfn_notify && user_data) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    for (cl_uint i = 0; i < num_devices; i++) {
        if (!cov::isValidObject<cov::Device>(devices[i])) {
            *errcode_ret = CL_INVALID_DEVICE;
            return nullptr;
        }
    }

    return cov::createContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
}